

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O3

Qiniu_Error
Qiniu_Rio_Put(Qiniu_Client *self,Qiniu_Rio_PutRet *ret,char *uptoken,char *key,Qiniu_ReaderAt f,
             Qiniu_Int64 fsize,Qiniu_Rio_PutExtra *extra1)

{
  Qiniu_Error QVar1;
  
  QVar1 = _Qiniu_Rio_Put(self,ret,uptoken,key,f,fsize,(Qiniu_FileInfo *)0x0,extra1,
                         (Qiniu_Rio_Recorder *)0x0);
  return QVar1;
}

Assistant:

static Qiniu_Error _Qiniu_Rio_Put(
    Qiniu_Client *self, Qiniu_Rio_PutRet *ret,
    const char *uptoken, const char *key, Qiniu_ReaderAt f, Qiniu_Int64 fsize, Qiniu_FileInfo *fi, Qiniu_Rio_PutExtra *extra1, Qiniu_Rio_Recorder *recorder)
{
    Qiniu_Int64 offbase;
    Qiniu_Rio_task *task;
    Qiniu_Rio_WaitGroup wg;
    Qiniu_Rio_PutExtra extra;
    Qiniu_Rio_ThreadModel tm;
    Qiniu_Auth auth, auth1 = self->auth;
    const char *accessKey = NULL, *bucketName = NULL;
    int i, last, blkSize;
    int nfails;
    int retCode;
    Qiniu_Count ninterrupts;
    struct _Qiniu_Uploading_Parts_Progress *uploadingPartProgress = NULL;
    Qiniu_Error err = Qiniu_Rio_PutExtra_Init(&extra, fsize, extra1);
    if (err.code != 200)
    {
        return err;
    }
    if (extra.upHost == NULL && (extra.upHosts == NULL || extra.upHostsCount == 0))
    {
        if (!Qiniu_Utils_Extract_Bucket(uptoken, &accessKey, &bucketName))
        {
            err.code = 400;
            err.message = "parse uptoken failed";
            return err;
        }
        err = _Qiniu_Region_Get_Up_Hosts(self, accessKey, bucketName, &extra.upHosts, &extra.upHostsCount);
        if (err.code != 200)
        {
            Qiniu_Free((void *)accessKey);
            Qiniu_Free((void *)bucketName);
            return err;
        }
    }
    if (extra.uploadingProgress != NULL)
    {
        uploadingPartProgress = _Qiniu_Uploading_Parts_Progress_New();
    }

    tm = extra.threadModel;
    wg = tm.itbl->WaitGroup(tm.self);

    last = extra.blockCnt - 1;
    blkSize = 1 << blockBits;
    nfails = 0;
    ninterrupts = 0;

    self->auth = auth = Qiniu_UptokenAuth(uptoken);

    Qiniu_Rio_loadProgresses(ret, &extra, recorder);
reinit:
    for (i = 0; i < (int)extra.blockCnt; i++)
    {
        task = (Qiniu_Rio_task *)malloc(sizeof(Qiniu_Rio_task));
        task->f = f;
        task->extra = &extra;
        task->recorder = recorder;
        task->mc = self;
        task->wg = wg;
        task->nfails = &nfails;
        task->ninterrupts = &ninterrupts;
        task->blkIdx = i;
        task->blkSize1 = blkSize;
        task->fsize = fsize;
        task->progress = uploadingPartProgress;
        if (i == last)
        {
            offbase = (Qiniu_Int64)(i) << blockBits;
            task->blkSize1 = (int)(fsize - offbase);
        }

        wg.itbl->Add(wg.self, 1);
        retCode = tm.itbl->RunTask(tm.self, Qiniu_Rio_doTask, task);
        if (retCode == QINIU_RIO_NOTIFY_EXIT)
        {
            wg.itbl->Done(wg.self);
            Qiniu_Count_Inc(&ninterrupts);
            Qiniu_Free((void *)task);
        }

        if (ninterrupts > 0)
        {
            break;
        }
    } // for

    wg.itbl->Wait(wg.self);
    if (nfails != 0)
    {
        err = ErrPutFailed;
    }
    else if (ninterrupts != 0)
    {
        err = ErrPutInterrupted;
    }
    else
    {
        const char *const *upHosts;
        size_t upHostsCount;

        if (extra.upHost != NULL)
        {
            upHosts = &extra.upHost;
            upHostsCount = 1;
        }
        else
        {
            upHosts = extra.upHosts;
            upHostsCount = extra.upHostsCount;
        }

        for (int tries = 0; tries < extra.tryTimes && tries <= self->hostsRetriesMax; tries++)
        {
            const char *upHost = upHosts[tries % upHostsCount];
            err = Qiniu_Rio_Mkfile(self, ret, upHost, key, fsize, &extra);
            if (err.code == Qiniu_Rio_InvalidCtx && recorder != NULL && recorder->toLoadProgresses == Qiniu_True && fi != NULL)
            {
                Qiniu_Rio_PutExtra_Clear(&extra);
                reinitializeRecorder(&extra, fi, recorder);
                goto reinit;
            }
            else if (err.code == 200 || _Qiniu_Should_Retry(err.code) == QINIU_DONT_RETRY)
            {
                if (err.code / 100 != 4 || err.code == Qiniu_Rio_InvalidCtx)
                {
                    Qiniu_Rio_clearProgresses(&extra, recorder);
                }
                break;
            }
        }
    }

    if (uploadingPartProgress != NULL)
    {
        _Qiniu_Uploading_Parts_Progress_Free(uploadingPartProgress);
    }
    Qiniu_Rio_PutExtra_Cleanup(&extra);
    Qiniu_Free((void *)accessKey);
    Qiniu_Free((void *)bucketName);
    wg.itbl->Release(wg.self);
    auth.itbl->Release(auth.self);
    self->auth = auth1;
    return err;
}